

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

node_t assignment_expression(void)

{
  int id;
  node_t pvVar1;
  node_t pvVar2;
  char *pcVar3;
  int op;
  
  backtrace_prepare();
  pvVar1 = unary_expression();
  if ((pvVar1 == (node_t)0x0) || (t->id != 0x3d)) {
    backtrace();
    pvVar1 = multiplicative_expression();
    if (pvVar1 != (node_t)0x0) {
      while( true ) {
        id = t->id;
        if ((id != 0x2d) && (id != 0x2b)) {
          return pvVar1;
        }
        next();
        pvVar2 = multiplicative_expression();
        if (pvVar2 == (node_t)0x0) break;
        pvVar1 = binop(id,pvVar1,pvVar2);
      }
      pcVar3 = token_name(id);
      err(E,"expected expression after %s",pcVar3);
    }
  }
  else {
    next();
    pvVar2 = assignment_expression();
    if (pvVar2 != (node_t)0x0) {
      pvVar1 = binop(0x3d,pvVar1,pvVar2);
      return pvVar1;
    }
    pcVar3 = token_name(0x3d);
    err(E,"expected expression after %s",pcVar3);
    sync();
  }
  return (node_t)0x0;
}

Assistant:

node_t assignment_expression()
{
    node_t n = NULL;
    backtrace_prepare();
    
    if ((n = unary_expression()))
    {
        if (assignment_operator())
        {
            node_t right = NULL;
            int op = t->id;
            next();
            if ((right = assignment_expression()))
            {
                n = binop(op, n, right);
                return n;
            }
            err(E, "expected expression after %s", token_name(op));
            sync(";");
            return NULL;
        }
        backtrace();
    }
    else
        backtrace();
    
    return conditional_expression();
}